

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver_dpll_triad_simd.cc
# Opt level: O0

bool anon_unknown.dwarf_12932::SolverDpllTriadSimd<0>::BoxRestrict<0>
               (State *state,int box_idx,Cells16 *candidates)

{
  bool bVar1;
  int in_ESI;
  long in_RDI;
  undefined8 extraout_XMM0_Qa;
  undefined8 extraout_XMM0_Qa_00;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  longlong in_YMM0_H;
  Bitvec16x16 *pBVar2;
  longlong in_register_00001218;
  Cells16 all_assertions;
  Cells16 triggered;
  Cells16 box_minimums;
  Cells16 counts;
  Band *v_band;
  Band *h_band;
  int box_j;
  int box_i;
  Bitvec16x16 eliminating;
  Cells16 *in_stack_00000140;
  Box *box;
  undefined4 in_stack_00000158;
  undefined2 in_stack_fffffffffffffe68;
  undefined2 uVar3;
  undefined2 in_stack_fffffffffffffe6a;
  undefined2 uVar4;
  undefined4 in_stack_fffffffffffffe6c;
  undefined2 in_stack_fffffffffffffe70;
  undefined2 uVar5;
  undefined2 in_stack_fffffffffffffe72;
  undefined2 uVar6;
  undefined4 in_stack_fffffffffffffe74;
  undefined2 in_stack_fffffffffffffe88;
  undefined2 in_stack_fffffffffffffe8a;
  undefined4 in_stack_fffffffffffffe8c;
  undefined2 in_stack_fffffffffffffe90;
  undefined2 in_stack_fffffffffffffe92;
  undefined4 in_stack_fffffffffffffe94;
  uint16_t in_stack_fffffffffffffeb8;
  bool local_143;
  undefined1 local_140 [6];
  uint16_t x04;
  undefined8 in_stack_fffffffffffffec8;
  Bitvec16x16 *in_stack_fffffffffffffed0;
  Bitvec16x16 local_100;
  Bitvec16x16 local_e0;
  longlong lStack_b0;
  longlong lStack_a8;
  long local_98;
  long local_90;
  int local_88;
  int local_84;
  undefined8 *local_58;
  int local_44;
  long local_40;
  bool local_31;
  
  local_58 = (undefined8 *)(in_RDI + 0xc0 + (long)in_ESI * 0x20);
  local_44 = in_ESI;
  local_40 = in_RDI;
  bVar1 = Bitvec16x16::SubsetOf
                    ((Bitvec16x16 *)
                     CONCAT44(in_stack_fffffffffffffe74,
                              CONCAT22(in_stack_fffffffffffffe72,in_stack_fffffffffffffe70)),
                     (Bitvec16x16 *)
                     CONCAT44(in_stack_fffffffffffffe6c,
                              CONCAT22(in_stack_fffffffffffffe6a,in_stack_fffffffffffffe68)));
  if (bVar1) {
    local_31 = true;
  }
  else {
    Bitvec16x16::and_not
              ((Bitvec16x16 *)
               CONCAT44(in_stack_fffffffffffffe94,
                        CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
               (Bitvec16x16 *)
               CONCAT44(in_stack_fffffffffffffe8c,
                        CONCAT22(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88)));
    local_84 = *(int *)((anonymous_namespace)::tables + (long)local_44 * 4 + 0x18b8);
    local_88 = *(int *)((anonymous_namespace)::tables + (long)local_44 * 4 + 0x18dc);
    local_90 = local_40 + (long)local_84 * 0x20;
    local_98 = local_40 + 0x60 + (long)local_88 * 0x20;
    do {
      x04 = (uint16_t)((ulong)_local_140 >> 0x30);
      Bitvec16x16::and_not
                ((Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe94,
                          CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                 (Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe8c,
                          CONCAT22(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88)));
      *local_58 = extraout_XMM0_Qa;
      local_58[1] = extraout_XMM0_Qb;
      local_58[2] = in_YMM0_H;
      local_58[3] = in_register_00001218;
      lStack_b0 = in_YMM0_H;
      lStack_a8 = in_register_00001218;
      Bitvec16x16::Popcounts9
                ((Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe94,
                          CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)));
      uVar3 = 1;
      uVar4 = 0;
      uVar5 = 6;
      uVar6 = 0;
      in_stack_fffffffffffffe88 = 1;
      in_stack_fffffffffffffe8a = 0;
      in_stack_fffffffffffffe90 = 6;
      in_stack_fffffffffffffe92 = 0;
      pBVar2 = (Bitvec16x16 *)0x0;
      local_e0.vec[2] = in_YMM0_H;
      local_e0.vec[3] = in_register_00001218;
      Bitvec16x16::Bitvec16x16
                (in_stack_fffffffffffffed0,(uint16_t)((ulong)in_stack_fffffffffffffec8 >> 0x30),
                 (uint16_t)((ulong)in_stack_fffffffffffffec8 >> 0x20),
                 (uint16_t)((ulong)in_stack_fffffffffffffec8 >> 0x10),
                 (uint16_t)in_stack_fffffffffffffec8,x04,1,6,1,1,1,6,6,6,6,0,
                 in_stack_fffffffffffffeb8);
      bVar1 = Bitvec16x16::AnyLessThan(&local_e0,&local_100);
      if (bVar1) {
        return false;
      }
      Bitvec16x16::WhichEqual
                ((Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe94,
                          CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                 (Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe8c,
                          CONCAT22(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88)));
      Bitvec16x16::operator&
                ((Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe94,
                          CONCAT22(in_stack_fffffffffffffe92,in_stack_fffffffffffffe90)),
                 (Bitvec16x16 *)
                 CONCAT44(in_stack_fffffffffffffe8c,
                          CONCAT22(in_stack_fffffffffffffe8a,in_stack_fffffffffffffe88)));
      in_YMM0_H = 0;
      in_register_00001218 = 0;
      _local_140 = extraout_XMM0_Qa_00;
      in_stack_fffffffffffffec8 = extraout_XMM0_Qb_00;
      (anonymous_namespace)::SolverDpllTriadSimd<0>::
      GatherTriadClauseAssertions<(anonymous_namespace)::SolverDpllTriadSimd<0>::BoxRestrict<0>((anonymous_namespace)::State&,int,Bitvec16x16_const&)::_lambda(Bitvec16x16_const&)_1_>
                (local_58,local_140);
      (anonymous_namespace)::SolverDpllTriadSimd<0>::
      GatherTriadClauseAssertions<(anonymous_namespace)::SolverDpllTriadSimd<0>::BoxRestrict<0>((anonymous_namespace)::State&,int,Bitvec16x16_const&)::_lambda(Bitvec16x16_const&)_2_>
                (local_58,local_140);
      AssertionsToEliminations
                (in_stack_00000140,eliminating.vec[3]._4_4_,(int)eliminating.vec[3],
                 (Cells16 *)eliminating.vec[2],(Cells08 *)eliminating.vec[1],
                 (Cells08 *)eliminating.vec[0]);
      bVar1 = Bitvec16x16::Intersects
                        ((Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffe74,CONCAT22(uVar6,uVar5)),
                         (Bitvec16x16 *)CONCAT44(in_stack_fffffffffffffe6c,CONCAT22(uVar4,uVar3)));
      in_stack_fffffffffffffed0 = pBVar2;
    } while (bVar1);
    bVar1 = BandEliminate<1>((State *)CONCAT44(box_idx,in_stack_00000158),candidates._4_4_,
                             (int)candidates);
    local_143 = false;
    if (bVar1) {
      local_143 = BandEliminate<0>((State *)CONCAT44(box_idx,in_stack_00000158),candidates._4_4_,
                                   (int)candidates);
    }
    local_31 = local_143;
  }
  return local_31;
}

Assistant:

static bool BoxRestrict(State &state, int box_idx, const Cells16 &candidates) {
        // return immediately if there are no new eliminations
        Box &box = state.boxen[box_idx];
        if (box.cells.SubsetOf(candidates)) return true;
        auto eliminating = box.cells.and_not(candidates);

        int box_i = tables.div3[box_idx];
        int box_j = tables.mod3[box_idx];

        Band &h_band = state.bands[0][box_i];
        Band &v_band = state.bands[1][box_j];
        do {
            // apply eliminations and check that no cell clause now violates its minimum
            box.cells = box.cells.and_not(eliminating);
            Cells16 counts = box.cells.Popcounts9();
            const Cells16 box_minimums{1, 1, 1, 6, 1, 1, 1, 6, 1, 1, 1, 6, 6, 6, 6, 0};
            if (counts.AnyLessThan(box_minimums)) return false;

            // gather literals asserted by triggered cell clauses
            Cells16 triggered = counts.WhichEqual(box_minimums);
            Cells16 all_assertions = box.cells & triggered;
            // and add literals asserted by triggered triad definition clauses
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateRows(); }, all_assertions);
            GatherTriadClauseAssertions(
                    box.cells, [](const Cells16 &x) { return x.RotateCols(); }, all_assertions);

            // construct elimination messages for this box and for our band peers
            AssertionsToEliminations(all_assertions, box_i, box_j, eliminating,
                                     h_band.eliminations, v_band.eliminations);

        } while (eliminating.Intersects(box.cells));

        // send elimination messages to horizontal and vertical peers. Prefer to send the first
        // of these messages to the peer whose orientation is opposite that of the inbound peer.
        if (from_vertical) {
            return BandEliminate<0>(state, box_i, box_j) &&
                   BandEliminate<1>(state, box_j, box_i);
        } else {
            return BandEliminate<1>(state, box_j, box_i) &&
                   BandEliminate<0>(state, box_i, box_j);
        }
    }